

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  int iVar1;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe z22;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  secp256k1_gej *in_stack_fffffffffffffdd0;
  
  secp256k1_gej_verify(in_stack_fffffffffffffdd0);
  secp256k1_gej_verify(in_stack_fffffffffffffdd0);
  if (*(int *)((long)in_RSI + 0x90) == 0) {
    if (*(int *)((long)in_RDX + 0x90) == 0) {
      secp256k1_fe_sqr(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                      );
      secp256k1_fe_sqr(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                      );
      secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                       ,(secp256k1_fe *)0x124e9e);
      secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                       ,(secp256k1_fe *)0x124ebb);
      secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                       ,(secp256k1_fe *)0x124edc);
      secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                       ,(secp256k1_fe *)0x124ef8);
      secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                       ,(secp256k1_fe *)0x124f19);
      secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                       ,(secp256k1_fe *)0x124f35);
      secp256k1_fe_negate_unchecked
                (&in_stack_fffffffffffffdd0->x,
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0);
      secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                      );
      secp256k1_fe_negate_unchecked
                (&in_stack_fffffffffffffdd0->x,
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0);
      secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                      );
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x124fa0);
      if (iVar1 == 0) {
        *(undefined4 *)((long)in_RDI + 0x90) = 0;
        secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (secp256k1_fe *)0x125032);
        if (in_RCX != (void *)0x0) {
          memcpy(in_RCX,&stack0xfffffffffffffdd0,0x30);
        }
        secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (secp256k1_fe *)0x125076);
        secp256k1_fe_sqr(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_fe_negate_unchecked
                  (&in_stack_fffffffffffffdd0->x,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0);
        secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (secp256k1_fe *)0x1250b1);
        secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (secp256k1_fe *)0x1250c8);
        secp256k1_fe_sqr(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (secp256k1_fe *)0x125143);
        secp256k1_fe_mul(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (secp256k1_fe *)0x125158);
        secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                         (secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        secp256k1_gej_verify(in_stack_fffffffffffffdd0);
      }
      else {
        iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x124fb2);
        if (iVar1 == 0) {
          if (in_RCX != (void *)0x0) {
            secp256k1_fe_set_int(&in_stack_fffffffffffffdd0->x,in_stack_fffffffffffffdcc);
          }
          secp256k1_gej_set_infinity((secp256k1_gej *)0x124ffd);
        }
        else {
          secp256k1_gej_double_var
                    (in_stack_fffffffffffffdd0,
                     (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (secp256k1_fe *)0x124fd4);
        }
      }
    }
    else {
      if (in_RCX != (void *)0x0) {
        secp256k1_fe_set_int(&in_stack_fffffffffffffdd0->x,in_stack_fffffffffffffdcc);
      }
      memcpy(in_RDI,in_RSI,0x98);
    }
  }
  else {
    if (in_RCX != (void *)0x0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/group_impl.h"
              ,0x1ef,"test condition failed: rzr == NULL");
      abort();
    }
    memcpy(in_RDI,in_RDX,0x98);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}